

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O3

Mat3x3d * __thiscall OpenMD::Atom::getI(Mat3x3d *__return_storage_ptr__,Atom *this)

{
  undefined8 *puVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  bool bVar8;
  undefined8 uVar9;
  SquareMatrix<double,_3> m;
  long lVar7;
  
  pdVar2 = m.super_RectMatrix<double,_3U,_3U>.data_[0] + 1;
  m.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
  m.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
  m.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
  m.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
  m.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
  m.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
  m.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  m.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
  m.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
  lVar3 = 0;
  lVar4 = 0;
  do {
    lVar5 = 0;
    auVar6 = _DAT_0028d380;
    do {
      bVar8 = SUB164(auVar6 ^ _DAT_0028d390,4) == -0x80000000 &&
              SUB164(auVar6 ^ _DAT_0028d390,0) < -0x7ffffffd;
      if (bVar8) {
        uVar9 = 0x3ff0000000000000;
        if (lVar3 != lVar5) {
          uVar9 = 0;
        }
        *(undefined8 *)((long)pdVar2 + lVar5 + -8) = uVar9;
      }
      if (bVar8) {
        uVar9 = 0x3ff0000000000000;
        if (lVar3 + -8 != lVar5) {
          uVar9 = 0;
        }
        *(undefined8 *)((long)pdVar2 + lVar5) = uVar9;
      }
      lVar7 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar7 + 2;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x20);
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 8;
    pdVar2 = pdVar2 + 3;
  } while (lVar4 != 3);
  lVar3 = 0;
  do {
    *(undefined8 *)
     ((long)(__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>
            .data_[0] + lVar3 + 0x10) =
         *(undefined8 *)((long)m.super_RectMatrix<double,_3U,_3U>.data_[0] + lVar3 + 0x10);
    uVar9 = *(undefined8 *)((long)m.super_RectMatrix<double,_3U,_3U>.data_[0] + lVar3 + 8);
    puVar1 = (undefined8 *)
             ((long)(__return_storage_ptr__->super_SquareMatrix<double,_3>).
                    super_RectMatrix<double,_3U,_3U>.data_[0] + lVar3);
    *puVar1 = *(undefined8 *)((long)m.super_RectMatrix<double,_3U,_3U>.data_[0] + lVar3);
    puVar1[1] = uVar9;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x48);
  return __return_storage_ptr__;
}

Assistant:

Mat3x3d Atom::getI() { return Mat3x3d::identity(); }